

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2streams.cpp
# Opt level: O2

void __thiscall Http2::Stream::Stream(Stream *this,QString *cacheKey,quint32 id,qint32 recvSize)

{
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*,_false>(&this->httpPair);
  this->streamID = id;
  this->sendWindow = 0xffff;
  this->recvWindow = recvSize;
  this->state = remoteReserved;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->key).d,&cacheKey->d);
  return;
}

Assistant:

Stream::Stream(const QString &cacheKey, quint32 id, qint32 recvSize)
    : streamID(id),
      // sendWindow is 0, this stream only receives data
      recvWindow(recvSize),
      state(remoteReserved),
      key(cacheKey)
{
}